

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanDynamicHeap.cpp
# Opt level: O0

void __thiscall
Diligent::VulkanDynamicMemoryManager::~VulkanDynamicMemoryManager(VulkanDynamicMemoryManager *this)

{
  OffsetType OVar1;
  unsigned_long uVar2;
  VkDeviceMemory_T *pVVar3;
  VkBuffer_T *pVVar4;
  Char *Message;
  unsigned_long *puVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char *in_stack_ffffffffffffff18;
  code *pcVar9;
  undefined1 local_a1;
  unsigned_long local_a0;
  double local_98;
  int local_8c;
  MemorySizeFormatter<unsigned_long> local_88;
  MemorySizeFormatter<unsigned_long> local_70;
  undefined1 local_58 [8];
  string _msg;
  OffsetType Size;
  string msg;
  VulkanDynamicMemoryManager *this_local;
  
  msg.field_2._8_8_ = this;
  pVVar3 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkDeviceMemory_T_
                     ((VulkanObjectWrapper *)&this->m_BufferMemory);
  if (pVVar3 == (VkDeviceMemory_T *)0x0) {
    pVVar4 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                       ((VulkanObjectWrapper *)&this->m_VkBuffer);
    if (pVVar4 == (VkBuffer_T *)0x0) goto LAB_0038cf03;
  }
  FormatString<char[60]>
            ((string *)&Size,
             (char (*) [60])"Vulkan resources must be explicitly released with Destroy()");
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"~VulkanDynamicMemoryManager",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanDynamicHeap.cpp"
             ,0x82);
  std::__cxx11::string::~string((string *)&Size);
LAB_0038cf03:
  _msg.field_2._8_8_ =
       DynamicHeap::MasterBlockListBasedManager::GetSize(&this->super_MasterBlockListBasedManager);
  FormatMemorySize<unsigned_long>(&local_70,_msg.field_2._8_8_,2,0);
  FormatMemorySize<unsigned_long>(&local_88,this->m_TotalPeakSize,2,_msg.field_2._8_8_);
  local_8c = (int)std::setprecision(1);
  OVar1 = this->m_TotalPeakSize;
  auVar7._8_4_ = (int)(OVar1 >> 0x20);
  auVar7._0_8_ = OVar1;
  auVar7._12_4_ = 0x45300000;
  local_a0 = 1;
  puVar5 = std::max<unsigned_long>((unsigned_long *)(_msg.field_2._M_local_buf + 8),&local_a0);
  uVar2 = *puVar5;
  auVar8._8_4_ = (int)(uVar2 >> 0x20);
  auVar8._0_8_ = uVar2;
  auVar8._12_4_ = 0x45300000;
  local_98 = (((auVar7._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)OVar1) - 4503599627370496.0)) /
             ((auVar8._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0))) * 100.0;
  local_a1 = 0x25;
  FormatString<char[72],Diligent::MemorySizeFormatter<unsigned_long>,char[24],Diligent::MemorySizeFormatter<unsigned_long>,char[21],std::ios_base&(std::ios_base&),std::_Setprecision,double,char>
            ((string *)local_58,
             (Diligent *)"Dynamic memory manager usage stats:\n                       Total size: ",
             (char (*) [72])&local_70,
             (MemorySizeFormatter<unsigned_long> *)". Peak allocated size: ",
             (char (*) [24])&local_88,(MemorySizeFormatter<unsigned_long> *)". Peak utilization: ",
             (char (*) [21])std::fixed,(_func_ios_base_ptr_ios_base_ptr *)&local_8c,
             (_Setprecision *)&local_98,(double *)&local_a1,in_stack_ffffffffffffff18);
  if (DebugMessageCallback != (undefined *)0x0) {
    pcVar9 = (code *)DebugMessageCallback;
    uVar6 = std::__cxx11::string::c_str();
    (*pcVar9)(0,uVar6,0);
  }
  std::__cxx11::string::~string((string *)local_58);
  VulkanUtilities::VulkanObjectWrapper<VkDeviceMemory_T_*,_(VulkanUtilities::VulkanHandleTypeId)6>::
  ~VulkanObjectWrapper(&this->m_BufferMemory);
  VulkanUtilities::VulkanObjectWrapper<VkBuffer_T_*,_(VulkanUtilities::VulkanHandleTypeId)2>::
  ~VulkanObjectWrapper(&this->m_VkBuffer);
  DynamicHeap::MasterBlockListBasedManager::~MasterBlockListBasedManager
            (&this->super_MasterBlockListBasedManager);
  return;
}

Assistant:

VulkanDynamicMemoryManager::~VulkanDynamicMemoryManager()
{
    VERIFY(m_BufferMemory == VK_NULL_HANDLE && m_VkBuffer == VK_NULL_HANDLE, "Vulkan resources must be explicitly released with Destroy()");
    auto Size = GetSize();
    LOG_INFO_MESSAGE("Dynamic memory manager usage stats:\n"
                     "                       Total size: ",
                     FormatMemorySize(Size, 2),
                     ". Peak allocated size: ", FormatMemorySize(m_TotalPeakSize, 2, Size),
                     ". Peak utilization: ",
                     std::fixed, std::setprecision(1), static_cast<double>(m_TotalPeakSize) / static_cast<double>(std::max(Size, size_t{1})) * 100.0, '%');
}